

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O2

CapabilitySet * __thiscall
spvtools::AssemblyGrammar::filterCapsAgainstTargetEnv
          (CapabilitySet *__return_storage_ptr__,AssemblyGrammar *this,Capability *cap_array,
          uint32_t count)

{
  uint32_t uVar1;
  spv_result_t sVar2;
  ulong uVar3;
  bool bVar4;
  spv_operand_desc entry;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_50;
  
  EnumSet<spv::Capability>::EnumSet(__return_storage_ptr__);
  uVar1 = spvVersionForTargetEnv(this->target_env_);
  uVar3 = (ulong)count;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    entry = (spv_operand_desc)0x0;
    sVar2 = lookupOperand(this,SPV_OPERAND_TYPE_CAPABILITY,*cap_array,&entry);
    if ((sVar2 == SPV_SUCCESS) &&
       ((((entry->minVersion <= uVar1 && (uVar1 <= entry->lastVersion)) ||
         (entry->numExtensions != 0)) || (entry->numCapabilities != 0)))) {
      EnumSet<spv::Capability>::insert(&local_50,__return_storage_ptr__,cap_array);
    }
    cap_array = cap_array + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

CapabilitySet AssemblyGrammar::filterCapsAgainstTargetEnv(
    const spv::Capability* cap_array, uint32_t count) const {
  CapabilitySet cap_set;
  const auto version = spvVersionForTargetEnv(target_env_);
  for (uint32_t i = 0; i < count; ++i) {
    spv_operand_desc entry = {};
    if (SPV_SUCCESS == lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                     static_cast<uint32_t>(cap_array[i]),
                                     &entry)) {
      // This token is visible in this environment if it's in an appropriate
      // core version, or it is enabled by a capability or an extension.
      if ((version >= entry->minVersion && version <= entry->lastVersion) ||
          entry->numExtensions > 0u || entry->numCapabilities > 0u) {
        cap_set.insert(cap_array[i]);
      }
    }
  }
  return cap_set;
}